

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_171beb8::AverageTest<unsigned_short>::AverageTest
          (AverageTest<unsigned_short> *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  ParamType *pPVar4;
  
  pPVar4 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
           ::GetParam();
  iVar1 = (pPVar4->
          super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
          ).super__Head_base<0UL,_int,_false>._M_head_impl;
  pPVar4 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
           ::GetParam();
  iVar2 = *(int *)&(pPVar4->
                   super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
                   ).
                   super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
                   .
                   super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
                   .field_0x14;
  pPVar4 = testing::
           WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
           ::GetParam();
  iVar3 = (pPVar4->
          super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
          ).super__Tuple_impl<1UL,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>
          .super__Tuple_impl<2UL,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>.
          super__Head_base<2UL,_int,_false>._M_head_impl;
  testing::Test::Test((Test *)this);
  (this->super_AverageTestBase<unsigned_short>).width_ = iVar1;
  (this->super_AverageTestBase<unsigned_short>).height_ = iVar2;
  (this->super_AverageTestBase<unsigned_short>).source_data_ = (unsigned_short *)0x0;
  (this->super_AverageTestBase<unsigned_short>).source_stride_ = 0;
  (this->super_AverageTestBase<unsigned_short>).bit_depth_ = iVar3;
  (this->super_AverageTestBase<unsigned_short>).rnd_.random_.state_ = 0xbaba;
  (this->super_AverageTestBase<unsigned_short>).super_Test._vptr_Test =
       (_func_int **)&PTR__AverageTest_00f44100;
  (this->
  super_WithParamInterface<std::tuple<int,_int,_int,_int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int)>_>
  )._vptr_WithParamInterface = (_func_int **)&PTR__AverageTest_00f44140;
  this->ref_elapsed_time_ = 0;
  this->opt_elapsed_time_ = 0;
  return;
}

Assistant:

AverageTest()
      : AverageTestBase<Pixel>(GET_PARAM(0), GET_PARAM(1), GET_PARAM(2)) {}